

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O3

void __thiscall luna::VM::Return(VM *this,Value *a,Instruction i)

{
  size_t *psVar1;
  State *pSVar2;
  anon_union_8_9_8deb4486_for_Value_0 *paVar3;
  uint uVar4;
  _List_node_base *p_Var5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  _List_node_base *p_Var10;
  int iVar11;
  
  pSVar2 = this->state_;
  if (i.opcode_ << 0x10 != -0x10000) {
    (pSVar2->stack_).top_ = a + ((int)(i.opcode_ << 0x10) >> 0x10);
  }
  if ((pSVar2->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)&pSVar2->calls_) {
    p_Var10 = (pSVar2->calls_).super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>.
              _M_impl._M_node.super__List_node_base._M_prev;
    p_Var5 = p_Var10[1]._M_prev;
    uVar7 = *(uint *)&p_Var10[3]._M_next;
    uVar8 = (ulong)((long)(pSVar2->stack_).top_ - (long)a) >> 4;
    if (uVar7 == 0xffffffff) {
      p_Var10 = p_Var5;
      if (0 < (int)uVar8) {
        do {
          *(ValueT *)&p_Var10->_M_prev = a->type_;
          paVar3 = &a->field_0;
          a = a + 1;
          p_Var5 = p_Var10 + 1;
          *(anon_union_8_9_8deb4486_for_Value_0 *)&p_Var10->_M_next = *paVar3;
          uVar7 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar7;
          p_Var10 = p_Var5;
        } while (uVar7 != 0);
      }
    }
    else {
      uVar9 = uVar8 & 0xffffffff;
      if ((int)uVar7 < (int)uVar8) {
        uVar9 = (ulong)uVar7;
      }
      iVar6 = (int)uVar9;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      else {
        do {
          *(ValueT *)&p_Var5->_M_prev = a->type_;
          paVar3 = &a->field_0;
          a = a + 1;
          *(anon_union_8_9_8deb4486_for_Value_0 *)&p_Var5->_M_next = *paVar3;
          p_Var5 = p_Var5 + 1;
          uVar4 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar4;
        } while (uVar4 != 0);
      }
      iVar11 = uVar7 - iVar6;
      if (iVar11 != 0 && iVar6 <= (int)uVar7) {
        do {
          ((anon_union_8_9_8deb4486_for_Value_0 *)&p_Var5->_M_next)->obj_ = (GCObject *)0x0;
          *(ValueT *)&p_Var5->_M_prev = ValueT_Nil;
          p_Var5 = p_Var5 + 1;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
    }
    Stack::SetNewTop(&this->state_->stack_,(Value *)p_Var5);
    p_Var5 = (this->state_->calls_).
             super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl._M_node.
             super__List_node_base._M_prev;
    psVar1 = &(this->state_->calls_).
              super__List_base<luna::CallInfo,_std::allocator<luna::CallInfo>_>._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var5);
    return;
  }
  __assert_fail("!state_->calls_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                0x199,"void luna::VM::Return(Value *, Instruction)");
}

Assistant:

void VM::Return(Value *a, Instruction i)
    {
        // Set stack top when return value count is fixed
        int ret_value_count = Instruction::GetParamsBx(i);
        if (ret_value_count != EXP_VALUE_COUNT_ANY)
            state_->stack_.top_ = a + ret_value_count;

        assert(!state_->calls_.empty());
        auto call = &state_->calls_.back();

        auto src = a;
        auto dst = call->func_;

        int expect_result = call->expect_result_;
        int result_count = state_->stack_.top_ - src;
        if (expect_result == EXP_VALUE_COUNT_ANY)
        {
            for (int i = 0; i < result_count; ++i)
                *dst++ = *src++;
        }
        else
        {
            int i = 0;
            int count = std::min(expect_result, result_count);
            for (; i < count; ++i)
                *dst++ = *src++;
            // No enough results for expect results, set remain as nil
            for (; i < expect_result; ++i, ++dst)
                dst->SetNil();
        }

        // Set new top and pop current CallInfo
        state_->stack_.SetNewTop(dst);
        state_->calls_.pop_back();
    }